

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::circle
          (Fl_PostScript_Graphics_Driver *this,double x,double y,double r)

{
  matrix *pmVar1;
  
  if (this->shape_ != 0) {
    clocale_printf(this,"%g %g %g 0 360 arc\n");
    return;
  }
  fwrite("GS\n",3,1,(FILE *)this->output);
  pmVar1 = (this->super_Fl_Graphics_Driver).fl_matrix;
  clocale_printf(this,"[%g %g %g %g %g %g] CT\n",pmVar1->a,pmVar1->b,pmVar1->c,pmVar1->d,pmVar1->x,
                 pmVar1->y);
  clocale_printf(this,"%g %g %g 0 360 arc\n",x,y,r);
  pmVar1 = (this->super_Fl_Graphics_Driver).fl_matrix;
  clocale_printf(this,"[%g %g %g %g %g %g] RCT\n",pmVar1->a,pmVar1->b,pmVar1->c,pmVar1->d,pmVar1->x,
                 pmVar1->y);
  fwrite("GR\n",3,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::circle(double x, double y, double r){
  if(shape_==NONE){
    fprintf(output, "GS\n");
    concat();
    //    fprintf(output, "BP\n");
    clocale_printf("%g %g %g 0 360 arc\n", x , y , r);
    reconcat();
    //    fprintf(output, "ELP\n");
    fprintf(output, "GR\n");
  }else
    
    clocale_printf("%g %g %g 0 360 arc\n", x , y , r);
  
}